

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteObjectLibStatement(cmNinjaNormalTargetGenerator *this)

{
  cmLocalNinjaGenerator *this_00;
  cmGeneratorTarget *pcVar1;
  cmGlobalNinjaGenerator *pcVar2;
  cmGeneratedFileStream *os;
  string local_1c8;
  cmNinjaDeps local_1a8;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  cmNinjaBuild build;
  cmNinjaNormalTargetGenerator *this_local;
  
  build.RspFile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"phony",&local_139);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_190,&this->super_cmNinjaTargetGenerator);
  std::operator+(&local_170,"Object library ",&local_190);
  std::__cxx11::string::operator=((string *)local_118,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  this_00 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetOutputs
            (this_00,pcVar1,(cmNinjaDeps *)((long)&build.Rule.field_2 + 8));
  cmNinjaTargetGenerator::GetObjects_abi_cxx11_(&local_1a8,&this->super_cmNinjaTargetGenerator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.ImplicitOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar2,(ostream *)os,(cmNinjaBuild *)local_118,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_118);
  pcVar2 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1c8,&this->super_cmNinjaTargetGenerator);
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar2,&local_1c8,pcVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteObjectLibStatement()
{
  // Write a phony output that depends on all object files.
  {
    cmNinjaBuild build("phony");
    build.Comment = "Object library " + this->GetTargetName();
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs);
    build.ExplicitDeps = this->GetObjects();
    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(this->GetTargetName(),
                                             this->GetGeneratorTarget());
}